

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O1

int aom_uleb_decode(uint8_t *buffer,size_t available,uint64_t *value,size_t *length)

{
  uint8_t uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  iVar2 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),buffer == (uint8_t *)0x0);
  if (value != (uint64_t *)0x0 && buffer != (uint8_t *)0x0) {
    *value = 0;
    bVar7 = available == 0;
    if (!bVar7) {
      uVar3 = available - 1;
      uVar6 = 7;
      if (uVar3 < 7) {
        uVar6 = uVar3;
      }
      bVar4 = 0;
      uVar5 = 0;
      do {
        *value = *value | (ulong)(buffer[uVar5] & 0x7f) << (bVar4 & 0x3f);
        uVar1 = buffer[uVar5];
        if (-1 < (char)uVar1) {
          if (length != (size_t *)0x0) {
            *length = uVar5 + 1;
          }
          uVar3 = (ulong)-(uint)(*(int *)((long)value + 4) != 0);
        }
        iVar2 = (int)uVar3;
        if (-1 < (char)uVar1) break;
        bVar7 = available <= uVar5 + 1 || 6 < uVar5;
        bVar4 = bVar4 + 7;
        bVar8 = uVar5 != uVar6;
        uVar5 = uVar5 + 1;
      } while (bVar8);
    }
    if (!bVar7) {
      return iVar2;
    }
  }
  return -1;
}

Assistant:

int aom_uleb_decode(const uint8_t *buffer, size_t available, uint64_t *value,
                    size_t *length) {
  if (buffer && value) {
    *value = 0;
    for (size_t i = 0; i < kMaximumLeb128Size && i < available; ++i) {
      const uint8_t decoded_byte = *(buffer + i) & kLeb128ByteMask;
      *value |= ((uint64_t)decoded_byte) << (i * 7);
      if ((*(buffer + i) >> 7) == 0) {
        if (length) {
          *length = i + 1;
        }

        // Fail on values larger than 32-bits to ensure consistent behavior on
        // 32 and 64 bit targets: value is typically used to determine buffer
        // allocation size.
        if (*value > UINT32_MAX) return -1;

        return 0;
      }
    }
  }

  // If we get here, either the buffer/value pointers were invalid,
  // or we ran over the available space
  return -1;
}